

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_index_load(BGZF *fp,char *bname,char *suffix)

{
  size_t sVar1;
  void *pvVar2;
  uint64_t uVar3;
  size_t sVar4;
  int local_68;
  char *local_60;
  int local_54;
  int local_50;
  int ret_1;
  int ret;
  int i;
  uint64_t x;
  FILE *idx;
  int slen;
  int blen;
  char *tmp;
  char *suffix_local;
  char *bname_local;
  BGZF *fp_local;
  
  _slen = (char *)0x0;
  tmp = suffix;
  suffix_local = bname;
  bname_local = (char *)fp;
  if (suffix != (char *)0x0) {
    sVar1 = strlen(bname);
    idx._4_4_ = (int)sVar1;
    sVar1 = strlen(tmp);
    idx._0_4_ = (int)sVar1;
    _slen = (char *)malloc((long)(idx._4_4_ + (int)idx + 1));
    if (_slen == (char *)0x0) {
      return -1;
    }
    memcpy(_slen,suffix_local,(long)idx._4_4_);
    memcpy(_slen + idx._4_4_,tmp,(long)((int)idx + 1));
  }
  if (_slen == (char *)0x0) {
    local_60 = suffix_local;
  }
  else {
    local_60 = _slen;
  }
  x = (uint64_t)fopen(local_60,"rb");
  if (_slen != (char *)0x0) {
    free(_slen);
  }
  if (x == 0) {
    fp_local._4_4_ = -1;
  }
  else {
    pvVar2 = calloc(1,0x18);
    *(void **)(bname_local + 0x48) = pvVar2;
    sVar1 = fread(&ret,1,8,(FILE *)x);
    if (sVar1 == 8) {
      if ((*(int *)bname_local << 0xc) >> 0x1e == 0) {
        local_68 = (int)_ret;
      }
      else {
        uVar3 = ed_swap_8(_ret);
        local_68 = (int)uVar3;
      }
      *(int *)(*(long *)(bname_local + 0x48) + 4) = local_68 + 1;
      **(int **)(bname_local + 0x48) = local_68 + 1;
      pvVar2 = malloc((long)*(int *)(*(long *)(bname_local + 0x48) + 4) << 4);
      *(void **)(*(long *)(bname_local + 0x48) + 8) = pvVar2;
      **(undefined8 **)(*(long *)(bname_local + 0x48) + 8) = 0;
      *(undefined8 *)(*(long *)(*(long *)(bname_local + 0x48) + 8) + 8) = 0;
      if ((*(int *)bname_local << 0xc) >> 0x1e == 0) {
        local_54 = 0;
        for (ret_1 = 1; ret_1 < **(int **)(bname_local + 0x48); ret_1 = ret_1 + 1) {
          sVar1 = fread(&ret,1,8,(FILE *)x);
          *(uint64_t *)(*(long *)(*(long *)(bname_local + 0x48) + 8) + (long)ret_1 * 0x10 + 8) =
               _ret;
          sVar4 = fread(&ret,1,8,(FILE *)x);
          local_54 = local_54 + (int)sVar1 + (int)sVar4;
          *(uint64_t *)(*(long *)(*(long *)(bname_local + 0x48) + 8) + (long)ret_1 * 0x10) = _ret;
        }
        if ((long)local_54 != (long)(**(int **)(bname_local + 0x48) + -1) * 0x10) {
          return -1;
        }
      }
      else {
        local_50 = 0;
        for (ret_1 = 1; ret_1 < **(int **)(bname_local + 0x48); ret_1 = ret_1 + 1) {
          sVar1 = fread(&ret,1,8,(FILE *)x);
          uVar3 = ed_swap_8(_ret);
          *(uint64_t *)(*(long *)(*(long *)(bname_local + 0x48) + 8) + (long)ret_1 * 0x10 + 8) =
               uVar3;
          sVar4 = fread(&ret,1,8,(FILE *)x);
          local_50 = local_50 + (int)sVar1 + (int)sVar4;
          uVar3 = ed_swap_8(_ret);
          *(uint64_t *)(*(long *)(*(long *)(bname_local + 0x48) + 8) + (long)ret_1 * 0x10) = uVar3;
        }
        if ((long)local_50 != (long)(**(int **)(bname_local + 0x48) + -1) * 0x10) {
          return -1;
        }
      }
      fclose((FILE *)x);
      fp_local._4_4_ = 0;
    }
    else {
      fp_local._4_4_ = -1;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int bgzf_index_load(BGZF *fp, const char *bname, const char *suffix)
{
    char *tmp = NULL;
    if ( suffix )
    {
        int blen = strlen(bname);
        int slen = strlen(suffix);
        tmp = (char*) malloc(blen + slen + 1);
        if ( !tmp ) return -1;
        memcpy(tmp,bname,blen);
        memcpy(tmp+blen,suffix,slen+1);
    }

    FILE *idx = fopen(tmp?tmp:bname,"rb");
    if ( tmp ) free(tmp);
    if ( !idx ) return -1;

    fp->idx = (bgzidx_t*) calloc(1,sizeof(bgzidx_t));
    uint64_t x;
    if ( fread(&x, 1, sizeof(x), idx) != sizeof(x) ) return -1;

    fp->idx->noffs = fp->idx->moffs = 1 + (fp->is_be ? ed_swap_8(x) : x);
    fp->idx->offs  = (bgzidx1_t*) malloc(fp->idx->moffs*sizeof(bgzidx1_t));
    fp->idx->offs[0].caddr = fp->idx->offs[0].uaddr = 0;

    int i;
    if ( fp->is_be )
    {
        int ret = 0;
        for (i=1; i<fp->idx->noffs; i++)
        {
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].caddr = ed_swap_8(x);
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].uaddr = ed_swap_8(x);
        }
        if ( ret != sizeof(x)*2*(fp->idx->noffs-1) ) return -1;
    }
    else
    {
        int ret = 0;
        for (i=1; i<fp->idx->noffs; i++)
        {
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].caddr = x;
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].uaddr = x;
        }
        if ( ret != sizeof(x)*2*(fp->idx->noffs-1) ) return -1;
    }
    fclose(idx);
    return 0;

}